

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O0

int lj_cf_string_gsub(lua_State *L)

{
  char cVar1;
  lua_State *plVar2;
  lua_Integer lVar3;
  char *pcVar4;
  TValue *in_RDI;
  char *e;
  luaL_Buffer b;
  MatchState ms;
  int n;
  int anchor;
  int max_s;
  int tr;
  char *p;
  char *src;
  size_t srcl;
  ErrMsg in_stack_ffffffffffffdd88;
  uint narg;
  lua_State *in_stack_ffffffffffffdd90;
  lua_State *in_stack_ffffffffffffdd98;
  int in_stack_ffffffffffffdda0;
  int in_stack_ffffffffffffdda4;
  lua_State *in_stack_ffffffffffffdda8;
  char *in_stack_ffffffffffffddb0;
  luaL_Buffer *in_stack_ffffffffffffddb8;
  MatchState *in_stack_ffffffffffffddc0;
  char *in_stack_ffffffffffffddd0;
  char *in_stack_ffffffffffffddd8;
  MatchState *in_stack_ffffffffffffdde0;
  lua_State *local_250;
  lua_State *local_248;
  TValue *local_240;
  undefined4 local_238;
  undefined4 local_234;
  int local_30;
  uint local_2c;
  int local_28;
  int local_24;
  char *local_20;
  lua_State *local_18;
  long local_10;
  TValue *local_8;
  
  local_8 = in_RDI;
  local_18 = (lua_State *)
             luaL_checklstring(in_stack_ffffffffffffdda8,in_stack_ffffffffffffdda4,
                               (size_t *)in_stack_ffffffffffffdd98);
  local_20 = luaL_checklstring(in_stack_ffffffffffffdda8,in_stack_ffffffffffffdda4,
                               (size_t *)in_stack_ffffffffffffdd98);
  local_24 = lua_type(in_stack_ffffffffffffdd98,(int)((ulong)in_stack_ffffffffffffdd90 >> 0x20));
  lVar3 = luaL_optinteger(in_stack_ffffffffffffdda8,in_stack_ffffffffffffdda4,
                          (lua_Integer)in_stack_ffffffffffffdd98);
  local_28 = (int)lVar3;
  cVar1 = *local_20;
  if (cVar1 == '^') {
    local_20 = local_20 + 1;
  }
  narg = (uint)(cVar1 == '^');
  local_30 = 0;
  local_2c = narg;
  if ((((local_24 != 3) && (local_24 != 4)) && (local_24 != 6)) && (local_24 != 5)) {
    lj_err_arg(in_stack_ffffffffffffdd90,narg,in_stack_ffffffffffffdd88);
  }
  luaL_buffinit((lua_State *)&local_8->field_2,(luaL_Buffer *)&stack0xffffffffffffdd98);
  local_240 = local_8;
  local_250 = local_18;
  local_248 = (lua_State *)((long)&(local_18->nextgc).gcptr32 + local_10);
  do {
    if (local_28 <= local_30) break;
    local_234 = 0;
    local_238 = 0;
    in_stack_ffffffffffffdd90 =
         (lua_State *)
         match(in_stack_ffffffffffffdde0,in_stack_ffffffffffffddd8,in_stack_ffffffffffffddd0);
    if (in_stack_ffffffffffffdd90 != (lua_State *)0x0) {
      local_30 = local_30 + 1;
      add_value(in_stack_ffffffffffffddc0,in_stack_ffffffffffffddb8,in_stack_ffffffffffffddb0,
                (char *)in_stack_ffffffffffffdda8);
    }
    if ((in_stack_ffffffffffffdd90 == (lua_State *)0x0) ||
       (plVar2 = in_stack_ffffffffffffdd90, in_stack_ffffffffffffdd90 <= local_18)) {
      if (local_248 <= local_18) break;
      in_stack_ffffffffffffdd88 = CONCAT13(1,(int3)in_stack_ffffffffffffdd88);
      if ((lua_State *)&local_250 <= in_stack_ffffffffffffdd98) {
        pcVar4 = luaL_prepbuffer((luaL_Buffer *)0x12ea8c);
        in_stack_ffffffffffffdd88 = CONCAT13(pcVar4 != (char *)0x0,(int3)in_stack_ffffffffffffdd88);
      }
      *(char *)&(in_stack_ffffffffffffdd98->nextgc).gcptr32 = (char)(local_18->nextgc).gcptr32;
      in_stack_ffffffffffffdd98 =
           (lua_State *)((long)&(in_stack_ffffffffffffdd98->nextgc).gcptr32 + 1);
      plVar2 = (lua_State *)((long)&(local_18->nextgc).gcptr32 + 1);
    }
    local_18 = plVar2;
  } while (local_2c == 0);
  luaL_addlstring((luaL_Buffer *)CONCAT44(in_stack_ffffffffffffdda4,in_stack_ffffffffffffdda0),
                  (char *)in_stack_ffffffffffffdd98,(size_t)in_stack_ffffffffffffdd90);
  luaL_pushresult((luaL_Buffer *)0x12eb0d);
  lua_pushinteger(in_stack_ffffffffffffdd90,CONCAT44(narg,in_stack_ffffffffffffdd88));
  return 2;
}

Assistant:

LJLIB_CF(string_gsub)
{
  size_t srcl;
  const char *src = luaL_checklstring(L, 1, &srcl);
  const char *p = luaL_checkstring(L, 2);
  int  tr = lua_type(L, 3);
  int max_s = luaL_optint(L, 4, (int)(srcl+1));
  int anchor = (*p == '^') ? (p++, 1) : 0;
  int n = 0;
  MatchState ms;
  luaL_Buffer b;
  if (!(tr == LUA_TNUMBER || tr == LUA_TSTRING ||
	tr == LUA_TFUNCTION || tr == LUA_TTABLE))
    lj_err_arg(L, 3, LJ_ERR_NOSFT);
  luaL_buffinit(L, &b);
  ms.L = L;
  ms.src_init = src;
  ms.src_end = src+srcl;
  while (n < max_s) {
    const char *e;
    ms.level = ms.depth = 0;
    e = match(&ms, src, p);
    if (e) {
      n++;
      add_value(&ms, &b, src, e);
    }
    if (e && e>src) /* non empty match? */
      src = e;  /* skip it */
    else if (src < ms.src_end)
      luaL_addchar(&b, *src++);
    else
      break;
    if (anchor)
      break;
  }
  luaL_addlstring(&b, src, (size_t)(ms.src_end-src));
  luaL_pushresult(&b);
  lua_pushinteger(L, n);  /* number of substitutions */
  return 2;
}